

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

int send_event(int event,Fl_Widget *to,Fl_Window *window)

{
  _func_int ***ppp_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Group *pFVar6;
  int iVar7;
  
  iVar4 = Fl::e_y;
  iVar3 = Fl::e_x;
  iVar2 = Fl::e_number;
  if (window == (Fl_Window *)0x0) {
    iVar5 = 0;
    iVar7 = 0;
  }
  else {
    iVar7 = (window->super_Fl_Group).super_Fl_Widget.x_;
    iVar5 = (window->super_Fl_Group).super_Fl_Widget.y_;
  }
  pFVar6 = (Fl_Group *)to;
  if (to != (Fl_Widget *)0x0) {
    do {
      if (0xef < *(uchar *)((long)&pFVar6->super_Fl_Widget + 0x6c)) {
        iVar7 = iVar7 - *(int *)((long)&pFVar6->super_Fl_Widget + 0x20);
        iVar5 = iVar5 - *(int *)((long)&pFVar6->super_Fl_Widget + 0x24);
      }
      ppp_Var1 = &(pFVar6->super_Fl_Widget)._vptr_Fl_Widget;
      pFVar6 = (Fl_Group *)ppp_Var1[1];
    } while ((Fl_Group *)ppp_Var1[1] != (Fl_Group *)0x0);
  }
  Fl::e_x = iVar7 + Fl::e_x;
  Fl::e_y = iVar5 + Fl::e_y;
  Fl::e_number = event;
  iVar7 = (*to->_vptr_Fl_Widget[3])(to);
  Fl::e_number = iVar2;
  Fl::e_y = iVar4;
  Fl::e_x = iVar3;
  return iVar7;
}

Assistant:

static int send_event(int event, Fl_Widget* to, Fl_Window* window) {
  int dx, dy;
  int old_event = Fl::e_number;
  if (window) {
    dx = window->x();
    dy = window->y();
  } else {
    dx = dy = 0;
  }
  for (const Fl_Widget* w = to; w; w = w->parent())
    if (w->type()>=FL_WINDOW) {dx -= w->x(); dy -= w->y();}
  int save_x = Fl::e_x; Fl::e_x += dx;
  int save_y = Fl::e_y; Fl::e_y += dy;
  int ret = to->handle(Fl::e_number = event);
  Fl::e_number = old_event;
  Fl::e_y = save_y;
  Fl::e_x = save_x;
  return ret;
}